

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_content(lysp_yin_ctx *ctx,yin_subelement *subelem_info,size_t subelem_info_size,
                        void *parent,ly_stmt parent_stmt,char **text_content,
                        lysp_ext_instance **exts)

{
  ulong uVar1;
  undefined8 uVar2;
  ly_stmt type;
  LY_ERR LVar3;
  yin_subelement *exp_first;
  char *pcVar4;
  char *pcVar5;
  char *local_108;
  ly_ctx *local_f8;
  uint64_t local_f0;
  ly_ctx *local_c0;
  ly_ctx *local_a8;
  ly_ctx *local_88;
  ly_ctx *local_78;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement *subelem;
  ly_stmt last_stmt;
  ly_stmt cur_stmt;
  LYXML_PARSER_STATUS next_status;
  LY_ERR ret;
  char **text_content_local;
  void *pvStack_30;
  ly_stmt parent_stmt_local;
  void *parent_local;
  size_t subelem_info_size_local;
  yin_subelement *subelem_info_local;
  lysp_yin_ctx *ctx_local;
  
  cur_stmt = LY_STMT_NONE;
  subelem._4_4_ = LY_STMT_NONE;
  _next_status = text_content;
  text_content_local._4_4_ = parent_stmt;
  pvStack_30 = parent;
  parent_local = (void *)subelem_info_size;
  subelem_info_size_local = (size_t)subelem_info;
  subelem_info_local = (yin_subelement *)ctx;
  if (ctx->xmlctx->status != LYXML_ELEM_CONTENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xd8b,
                  "LY_ERR yin_parse_content(struct lysp_yin_ctx *, struct yin_subelement *, size_t, const void *, enum ly_stmt, const char **, struct lysp_ext_instance **)"
                 );
  }
  if ((ctx->xmlctx->field_5).ws_only == '\0') {
    last_stmt = LY_STMT_NOTIFICATION;
  }
  else {
    cur_stmt = lyxml_ctx_peek(ctx->xmlctx,&last_stmt);
    if (cur_stmt != LY_SUCCESS) {
      return cur_stmt;
    }
  }
  if (last_stmt == LY_STMT_NONE) {
    cur_stmt = lyxml_ctx_next(*(lyxml_ctx **)(subelem_info_local + 3));
    if (cur_stmt != LY_SUCCESS) {
      return cur_stmt;
    }
    while (*(int *)(*(long *)(subelem_info_local + 3) + 0x10) == 0) {
      type = yin_match_keyword((lysp_yin_ctx *)subelem_info_local,
                               *(char **)(*(long *)(subelem_info_local + 3) + 0x28),
                               *(size_t *)(*(long *)(subelem_info_local + 3) + 0x30),
                               *(char **)(*(long *)(subelem_info_local + 3) + 0x18),
                               *(size_t *)(*(long *)(subelem_info_local + 3) + 0x20),
                               text_content_local._4_4_);
      exp_first = get_record(type,(uint64_t)parent_local,(yin_subelement *)subelem_info_size_local);
      if (exp_first == (yin_subelement *)0x0) {
        if ((text_content_local._4_4_ == LY_STMT_DEVIATE) &&
           ((((((type == LY_STMT_CONFIG || (type == LY_STMT_DEFAULT)) || (type == LY_STMT_MANDATORY)
               ) || ((type == LY_STMT_MAX_ELEMENTS || (type == LY_STMT_MIN_ELEMENTS)))) ||
             ((type == LY_STMT_MUST || ((type == LY_STMT_TYPE || (type == LY_STMT_UNIQUE)))))) ||
            ((type == LY_STMT_UNITS || (type == LY_STMT_EXTENSION_INSTANCE)))))) {
          if (subelem_info_local == (yin_subelement *)0x0) {
            local_78 = (ly_ctx *)0x0;
          }
          else {
            local_78 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)((long)subelem_info_local[2].dest + 8) +
                          (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8);
          }
          pcVar4 = lyplg_ext_stmt2str(type);
          ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX_YIN,
                  "Deviate of this type doesn\'t allow \"%s\" as it\'s sub-element.",pcVar4);
        }
        else {
          if (subelem_info_local == (yin_subelement *)0x0) {
            local_88 = (ly_ctx *)0x0;
          }
          else {
            local_88 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)((long)subelem_info_local[2].dest + 8) +
                          (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8);
          }
          uVar1 = *(ulong *)(*(long *)(subelem_info_local + 3) + 0x30);
          uVar2 = *(undefined8 *)(*(long *)(subelem_info_local + 3) + 0x28);
          pcVar4 = lyplg_ext_stmt2str(text_content_local._4_4_);
          ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YIN,
                  "Unexpected sub-element \"%.*s\" of \"%s\" element.",uVar1 & 0xffffffff,uVar2,
                  pcVar4);
        }
        return LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION;
      }
      if ((text_content_local._4_4_ == LY_STMT_MODULE) ||
         (text_content_local._4_4_ == LY_STMT_SUBMODULE)) {
        LVar3 = yin_check_relative_order
                          ((lysp_yin_ctx *)subelem_info_local,subelem._4_4_,type,
                           text_content_local._4_4_);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        cur_stmt = LY_STMT_NONE;
      }
      if (((exp_first->flags & 2) != 0) && ((exp_first->flags & 0x80) != 0)) {
        if (subelem_info_local == (yin_subelement *)0x0) {
          local_a8 = (ly_ctx *)0x0;
        }
        else {
          local_a8 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)((long)subelem_info_local[2].dest + 8) +
                        (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8);
        }
        pcVar4 = lyplg_ext_stmt2str(type);
        pcVar5 = lyplg_ext_stmt2str(text_content_local._4_4_);
        ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YIN,
                "Redefinition of \"%s\" sub-element in \"%s\" element.",pcVar4,pcVar5);
        return LY_EVALID;
      }
      if ((exp_first->flags & 4) != 0) {
        LVar3 = yin_check_subelem_first_constraint
                          ((lysp_yin_ctx *)subelem_info_local,
                           (yin_subelement *)subelem_info_size_local,(char)parent_local,
                           text_content_local._4_4_,exp_first);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        cur_stmt = LY_STMT_NONE;
      }
      if (((exp_first->flags & 8) != 0) &&
         (*(byte *)(*(long *)(*(long *)((long)subelem_info_local[2].dest + 8) +
                             (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8) + 0x78
                   ) < 2)) {
        if (subelem_info_local == (yin_subelement *)0x0) {
          local_c0 = (ly_ctx *)0x0;
        }
        else {
          local_c0 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)((long)subelem_info_local[2].dest + 8) +
                        (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8);
        }
        pcVar4 = lyplg_ext_stmt2str(type);
        pcVar5 = lyplg_ext_stmt2str(text_content_local._4_4_);
        ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YIN,
                "Invalid sub-elemnt \"%s\" of \"%s\" element - this sub-element is allowed only in modules with version 1.1 or newer."
                ,pcVar4,pcVar5);
        return LY_EVALID;
      }
      exp_first->flags = exp_first->flags | 0x80;
      if (type == LY_STMT_NOTIFICATION) {
        cur_stmt = yin_parse_notification
                             ((lysp_yin_ctx *)subelem_info_local,(tree_node_meta *)exp_first->dest);
      }
      else if ((type == LY_STMT_INPUT) || (type == LY_STMT_OUTPUT)) {
        cur_stmt = yin_parse_inout((lysp_yin_ctx *)subelem_info_local,type,
                                   (inout_meta *)exp_first->dest);
      }
      else if ((type == LY_STMT_ACTION) || (type == LY_STMT_RPC)) {
        cur_stmt = yin_parse_action((lysp_yin_ctx *)subelem_info_local,
                                    (tree_node_meta *)exp_first->dest);
      }
      else if ((type == LY_STMT_ANYDATA) || (type == LY_STMT_ANYXML)) {
        cur_stmt = yin_parse_any((lysp_yin_ctx *)subelem_info_local,type,
                                 (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_AUGMENT) {
        cur_stmt = yin_parse_augment((lysp_yin_ctx *)subelem_info_local,
                                     (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_CASE) {
        cur_stmt = yin_parse_case((lysp_yin_ctx *)subelem_info_local,
                                  (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_CHOICE) {
        cur_stmt = yin_parse_choice((lysp_yin_ctx *)subelem_info_local,
                                    (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_CONTAINER) {
        cur_stmt = yin_parse_container((lysp_yin_ctx *)subelem_info_local,
                                       (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_GROUPING) {
        cur_stmt = yin_parse_grouping((lysp_yin_ctx *)subelem_info_local,
                                      (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_LEAF) {
        cur_stmt = yin_parse_leaf((lysp_yin_ctx *)subelem_info_local,
                                  (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_LEAF_LIST) {
        cur_stmt = yin_parse_leaflist((lysp_yin_ctx *)subelem_info_local,
                                      (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_LIST) {
        cur_stmt = yin_parse_list((lysp_yin_ctx *)subelem_info_local,
                                  (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_USES) {
        cur_stmt = yin_parse_uses((lysp_yin_ctx *)subelem_info_local,
                                  (tree_node_meta *)exp_first->dest);
      }
      else if (type == LY_STMT_ARGUMENT) {
        cur_stmt = yin_parse_argument((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                      (yin_argument_meta *)exp_first->dest,exts);
      }
      else if (type == LY_STMT_BASE) {
        cur_stmt = yin_parse_base((lysp_yin_ctx *)subelem_info_local,text_content_local._4_4_,
                                  exp_first->dest,exts);
      }
      else if (type == LY_STMT_BELONGS_TO) {
        cur_stmt = yin_parse_belongs_to
                             ((lysp_yin_ctx *)subelem_info_local,(lysp_submodule *)exp_first->dest,
                              exts);
      }
      else if (type == LY_STMT_BIT) {
        cur_stmt = yin_parse_bit((lysp_yin_ctx *)subelem_info_local,(lysp_type *)exp_first->dest);
      }
      else if (type == LY_STMT_CONFIG) {
        cur_stmt = yin_parse_config((lysp_yin_ctx *)subelem_info_local,(uint16_t *)exp_first->dest,
                                    exts);
      }
      else if (type == LY_STMT_CONTACT) {
LAB_001d7dca:
        cur_stmt = yin_parse_meta((lysp_yin_ctx *)subelem_info_local,pvStack_30,type,
                                  (char **)exp_first->dest,exts);
      }
      else if (type == LY_STMT_DEFAULT) {
        cur_stmt = yin_parse_qname((lysp_yin_ctx *)subelem_info_local,LY_STMT_DEFAULT,exp_first,exts
                                  );
      }
      else {
        if (type == LY_STMT_DESCRIPTION) goto LAB_001d7dca;
        if (type == LY_STMT_DEVIATE) {
          cur_stmt = yin_parse_deviate((lysp_yin_ctx *)subelem_info_local,
                                       (lysp_deviate **)exp_first->dest);
        }
        else if (type == LY_STMT_DEVIATION) {
          cur_stmt = yin_parse_deviation((lysp_yin_ctx *)subelem_info_local,
                                         (lysp_deviation **)exp_first->dest);
        }
        else if (type == LY_STMT_ENUM) {
          cur_stmt = yin_parse_enum((lysp_yin_ctx *)subelem_info_local,(lysp_type *)exp_first->dest)
          ;
        }
        else if (type == LY_STMT_ERROR_APP_TAG) {
LAB_001d7e23:
          cur_stmt = yin_parse_simple_elem
                               ((lysp_yin_ctx *)subelem_info_local,pvStack_30,type,exp_first,
                                YIN_ARG_VALUE,Y_STR_ARG,exts);
        }
        else if (type == LY_STMT_ERROR_MESSAGE) {
          cur_stmt = yin_parse_err_msg((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                       (char **)exp_first->dest,exts);
        }
        else if (type == LY_STMT_EXTENSION) {
          cur_stmt = yin_parse_extension((lysp_yin_ctx *)subelem_info_local,
                                         (lysp_ext **)exp_first->dest);
        }
        else if (type == LY_STMT_EXTENSION_INSTANCE) {
          if (exp_first->dest == (void *)0x0) {
            local_f0 = 0;
          }
          else {
            local_f0 = *exp_first->dest;
          }
          cur_stmt = yin_parse_extension_instance
                               ((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                text_content_local._4_4_,local_f0,exts);
        }
        else if (type == LY_STMT_FEATURE) {
          cur_stmt = yin_parse_feature((lysp_yin_ctx *)subelem_info_local,
                                       (lysp_feature **)exp_first->dest);
        }
        else if (type == LY_STMT_FRACTION_DIGITS) {
          cur_stmt = yin_parse_fracdigits
                               ((lysp_yin_ctx *)subelem_info_local,(lysp_type *)exp_first->dest);
        }
        else if (type == LY_STMT_IDENTITY) {
          cur_stmt = yin_parse_identity((lysp_yin_ctx *)subelem_info_local,
                                        (lysp_ident **)exp_first->dest);
        }
        else if (type == LY_STMT_IF_FEATURE) {
LAB_001d7f73:
          cur_stmt = yin_parse_qname((lysp_yin_ctx *)subelem_info_local,type,exp_first,exts);
        }
        else if (type == LY_STMT_IMPORT) {
          cur_stmt = yin_parse_import((lysp_yin_ctx *)subelem_info_local,
                                      (import_meta *)exp_first->dest);
        }
        else if (type == LY_STMT_INCLUDE) {
          if ((text_content_local._4_4_ == LY_STMT_SUBMODULE) &&
             (*(char *)(*(long *)(*(long *)((long)subelem_info_local[2].dest + 8) +
                                 (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8) +
                       0x78) == '\x02')) {
            if (subelem_info_local == (yin_subelement *)0x0) {
              local_f8 = (ly_ctx *)0x0;
            }
            else {
              local_f8 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)((long)subelem_info_local[2].dest + 8) +
                            (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8);
            }
            ly_log(local_f8,LY_LLWRN,LY_SUCCESS,
                   "YANG version 1.1 expects all includes in main module, includes in submodules (%s) are not necessary."
                   ,*(undefined8 *)
                     (*(long *)(*(long *)((long)subelem_info_local[2].dest + 8) +
                               (ulong)(*(int *)((long)subelem_info_local[2].dest + 4) - 1) * 8) +
                     0x80));
          }
          cur_stmt = yin_parse_include((lysp_yin_ctx *)subelem_info_local,
                                       (include_meta *)exp_first->dest);
        }
        else {
          if (type == LY_STMT_KEY) goto LAB_001d7e23;
          if (type == LY_STMT_LENGTH) {
            cur_stmt = yin_parse_length((lysp_yin_ctx *)subelem_info_local,
                                        (lysp_type *)exp_first->dest);
          }
          else if (type == LY_STMT_MANDATORY) {
            cur_stmt = yin_parse_mandatory((lysp_yin_ctx *)subelem_info_local,
                                           (uint16_t *)exp_first->dest,exts);
          }
          else if ((type == LY_STMT_MAX_ELEMENTS) || (type == LY_STMT_MIN_ELEMENTS)) {
            cur_stmt = yin_parse_minmax((lysp_yin_ctx *)subelem_info_local,text_content_local._4_4_,
                                        type,exp_first->dest);
          }
          else if (type == LY_STMT_MODIFIER) {
            cur_stmt = yin_parse_modifier((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                          (char **)exp_first->dest,exts);
          }
          else if (type == LY_STMT_MUST) {
            cur_stmt = yin_parse_must((lysp_yin_ctx *)subelem_info_local,
                                      (lysp_restr **)exp_first->dest);
          }
          else if (type == LY_STMT_NAMESPACE) {
            cur_stmt = yin_parse_simple_elem
                                 ((lysp_yin_ctx *)subelem_info_local,pvStack_30,LY_STMT_NAMESPACE,
                                  exp_first,YIN_ARG_URI,Y_STR_ARG,exts);
          }
          else if (type == LY_STMT_ORDERED_BY) {
            cur_stmt = yin_parse_orderedby((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                           (uint16_t *)exp_first->dest,exts);
          }
          else {
            if (type == LY_STMT_ORGANIZATION) goto LAB_001d7dca;
            if (type == LY_STMT_PATH) {
              cur_stmt = yin_parse_path((lysp_yin_ctx *)subelem_info_local,
                                        (lysp_type *)exp_first->dest);
            }
            else if (type == LY_STMT_PATTERN) {
              cur_stmt = yin_parse_pattern((lysp_yin_ctx *)subelem_info_local,
                                           (lysp_type *)exp_first->dest);
            }
            else if (type == LY_STMT_POSITION) {
LAB_001d8248:
              cur_stmt = yin_parse_value_pos((lysp_yin_ctx *)subelem_info_local,type,
                                             (lysp_type_enum *)exp_first->dest);
            }
            else if (type == LY_STMT_PREFIX) {
              cur_stmt = yin_parse_simple_elem
                                   ((lysp_yin_ctx *)subelem_info_local,*exp_first->dest,
                                    LY_STMT_PREFIX,exp_first,YIN_ARG_VALUE,Y_IDENTIF_ARG,exts);
            }
            else if (type == LY_STMT_PRESENCE) {
              cur_stmt = yin_parse_simple_elem
                                   ((lysp_yin_ctx *)subelem_info_local,*exp_first->dest,
                                    LY_STMT_PRESENCE,exp_first,YIN_ARG_VALUE,Y_STR_ARG,exts);
            }
            else if (type == LY_STMT_RANGE) {
              cur_stmt = yin_parse_range((lysp_yin_ctx *)subelem_info_local,
                                         (lysp_type *)exp_first->dest);
            }
            else {
              if (type == LY_STMT_REFERENCE) goto LAB_001d7dca;
              if (type == LY_STMT_REFINE) {
                cur_stmt = yin_parse_refine((lysp_yin_ctx *)subelem_info_local,
                                            (lysp_refine **)exp_first->dest);
              }
              else if (type == LY_STMT_REQUIRE_INSTANCE) {
                cur_stmt = yin_pasrse_reqinstance
                                     ((lysp_yin_ctx *)subelem_info_local,
                                      (lysp_type *)exp_first->dest);
              }
              else if (type == LY_STMT_REVISION) {
                cur_stmt = yin_parse_revision((lysp_yin_ctx *)subelem_info_local,
                                              (lysp_revision **)exp_first->dest);
              }
              else if (type == LY_STMT_REVISION_DATE) {
                cur_stmt = yin_parse_revision_date
                                     ((lysp_yin_ctx *)subelem_info_local,(char *)exp_first->dest,
                                      exts);
              }
              else if (type == LY_STMT_STATUS) {
                cur_stmt = yin_parse_status((lysp_yin_ctx *)subelem_info_local,
                                            (uint16_t *)exp_first->dest,exts);
              }
              else if (type == LY_STMT_TYPE) {
                cur_stmt = yin_parse_type((lysp_yin_ctx *)subelem_info_local,
                                          text_content_local._4_4_,exp_first);
              }
              else if (type == LY_STMT_TYPEDEF) {
                cur_stmt = yin_parse_typedef((lysp_yin_ctx *)subelem_info_local,
                                             (tree_node_meta *)exp_first->dest);
              }
              else {
                if (type == LY_STMT_UNIQUE) goto LAB_001d7f73;
                if (type == LY_STMT_UNITS) {
                  cur_stmt = yin_parse_simple_elem
                                       ((lysp_yin_ctx *)subelem_info_local,*exp_first->dest,
                                        LY_STMT_UNITS,exp_first,YIN_ARG_NAME,Y_STR_ARG,exts);
                }
                else {
                  if (type == LY_STMT_VALUE) goto LAB_001d8248;
                  if (type == LY_STMT_WHEN) {
                    cur_stmt = yin_parse_when((lysp_yin_ctx *)subelem_info_local,
                                              (lysp_when **)exp_first->dest);
                  }
                  else if (type == LY_STMT_YANG_VERSION) {
                    cur_stmt = yin_parse_yangversion
                                         ((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                          (uint8_t *)exp_first->dest,exts);
                  }
                  else if (type == LY_STMT_YIN_ELEMENT) {
                    cur_stmt = yin_parse_yin_element
                                         ((lysp_yin_ctx *)subelem_info_local,pvStack_30,
                                          (uint16_t *)exp_first->dest,exts);
                  }
                  else if (type - LY_STMT_ARG_TEXT < 2) {
                    LVar3 = lyxml_ctx_next(*(lyxml_ctx **)(subelem_info_local + 3));
                    while( true ) {
                      if (LVar3 != LY_SUCCESS) {
                        return LVar3;
                      }
                      cur_stmt = LY_STMT_NONE;
                      if (((lysp_yin_ctx *)subelem_info_local)->xmlctx->status != LYXML_ATTRIBUTE)
                      break;
                      cur_stmt = lyxml_ctx_next(((lysp_yin_ctx *)subelem_info_local)->xmlctx);
                      if (cur_stmt != LY_SUCCESS) {
                        return cur_stmt;
                      }
                      LVar3 = lyxml_ctx_next(*(lyxml_ctx **)(subelem_info_local + 3));
                    }
                    cur_stmt = yin_parse_content((lysp_yin_ctx *)subelem_info_local,
                                                 (yin_subelement *)0x0,0,pvStack_30,type,
                                                 (char **)exp_first->dest,(lysp_ext_instance **)0x0)
                    ;
                  }
                  else {
                    ly_log((ly_ctx *)**(undefined8 **)(subelem_info_local + 3),LY_LLERR,LY_EINT,
                           "Internal error (%s:%d).",
                           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                           ,0xe90);
                    cur_stmt = LY_STMT_OUTPUT|LY_STMT_INPUT;
                  }
                }
              }
            }
          }
        }
      }
      if (cur_stmt != LY_STMT_NONE) {
        return cur_stmt;
      }
      cur_stmt = lyxml_ctx_next(*(lyxml_ctx **)(subelem_info_local + 3));
      subelem._4_4_ = type;
      if (cur_stmt != LY_SUCCESS) {
        return cur_stmt;
      }
    }
  }
  else {
    if (cur_stmt != LY_STMT_NONE) {
      return cur_stmt;
    }
    LVar3 = yin_validate_value((lysp_yin_ctx *)subelem_info_local,Y_STR_ARG);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (_next_status != (char **)0x0) {
      if (*(char *)(*(long *)(subelem_info_local + 3) + 0x30) == '\0') {
        if (*(long *)(*(long *)(subelem_info_local + 3) + 0x20) == 0) {
          local_108 = "";
        }
        else {
          local_108 = *(char **)(*(long *)(subelem_info_local + 3) + 0x18);
        }
        LVar3 = lydict_insert((ly_ctx *)**(undefined8 **)(subelem_info_local + 3),local_108,
                              *(size_t *)(*(long *)(subelem_info_local + 3) + 0x20),_next_status);
      }
      else {
        LVar3 = lydict_insert_zc((ly_ctx *)**(undefined8 **)(subelem_info_local + 3),
                                 *(char **)(*(long *)(subelem_info_local + 3) + 0x18),_next_status);
      }
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      *(undefined1 *)(*(long *)(subelem_info_local + 3) + 0x30) = 0;
      if (*_next_status == (char *)0x0) {
        return LY_EMEM;
      }
    }
    cur_stmt = lyxml_ctx_next(*(lyxml_ctx **)(subelem_info_local + 3));
    if (cur_stmt != LY_SUCCESS) {
      return cur_stmt;
    }
  }
  LVar3 = yin_check_subelem_mandatory_constraint
                    ((lysp_yin_ctx *)subelem_info_local,(yin_subelement *)subelem_info_size_local,
                     (char)parent_local,text_content_local._4_4_);
  if (LVar3 == LY_SUCCESS) {
    return cur_stmt;
  }
  return LVar3;
}

Assistant:

LY_ERR
yin_parse_content(struct lysp_yin_ctx *ctx, struct yin_subelement *subelem_info, size_t subelem_info_size,
        const void *parent, enum ly_stmt parent_stmt, const char **text_content, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    enum LYXML_PARSER_STATUS next_status;
    enum ly_stmt cur_stmt = LY_STMT_NONE, last_stmt = LY_STMT_NONE;
    struct yin_subelement *subelem = NULL;

    assert(ctx->xmlctx->status == LYXML_ELEM_CONTENT);

    if (ctx->xmlctx->ws_only) {
        /* check whether there are any children */
        LY_CHECK_GOTO(ret = lyxml_ctx_peek(ctx->xmlctx, &next_status), cleanup);
    } else {
        /* we want to parse the value */
        next_status = LYXML_ELEM_CLOSE;
    }

    if (next_status == LYXML_ELEMENT) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* current element has subelements as content */
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* match keyword */
            last_stmt = cur_stmt;
            cur_stmt = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
                    ctx->xmlctx->prefix_len, parent_stmt);

            /* check if this element can be child of current element */
            subelem = get_record(cur_stmt, subelem_info_size, subelem_info);
            if (!subelem) {
                if ((parent_stmt == LY_STMT_DEVIATE) && isdevsub(cur_stmt)) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INDEV_YIN, lyplg_ext_stmt2str(cur_stmt));
                } else {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len,
                            ctx->xmlctx->name, lyplg_ext_stmt2str(parent_stmt));
                }
                ret = LY_EVALID;
                goto cleanup;
            }

            /* relative order is required only in module and submodule sub-elements */
            if ((parent_stmt == LY_STMT_MODULE) || (parent_stmt == LY_STMT_SUBMODULE)) {
                ret = yin_check_relative_order(ctx, last_stmt, cur_stmt, parent_stmt);
                LY_CHECK_GOTO(ret, cleanup);
            }

            /* flag check */
            if ((subelem->flags & YIN_SUBELEM_UNIQUE) && (subelem->flags & YIN_SUBELEM_PARSED)) {
                /* subelement uniquenes */
                LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_SUBELEM_REDEF, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                return LY_EVALID;
            }
            if (subelem->flags & YIN_SUBELEM_FIRST) {
                /* subelement is supposed to be defined as first subelement */
                ret = yin_check_subelem_first_constraint(ctx, subelem_info, subelem_info_size, parent_stmt, subelem);
                LY_CHECK_GOTO(ret, cleanup);
            }
            if (subelem->flags & YIN_SUBELEM_VER2) {
                /* subelement is supported only in version 1.1 or higher */
                if (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1) {
                    LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INSUBELEM2, lyplg_ext_stmt2str(cur_stmt), lyplg_ext_stmt2str(parent_stmt));
                    ret = LY_EVALID;
                    goto cleanup;
                }
            }
            /* note that element was parsed for easy uniqueness check in next iterations */
            subelem->flags |= YIN_SUBELEM_PARSED;

            switch (cur_stmt) {
            /* call responsible function */
            case LY_STMT_EXTENSION_INSTANCE:
                ret = yin_parse_extension_instance(ctx, parent, parent_stmt,
                        (subelem->dest) ? *((LY_ARRAY_COUNT_TYPE *)subelem->dest) : 0, exts);
                break;
            case LY_STMT_ACTION:
            case LY_STMT_RPC:
                ret = yin_parse_action(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ANYDATA:
            case LY_STMT_ANYXML:
                ret = yin_parse_any(ctx, cur_stmt, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ARGUMENT:
                ret = yin_parse_argument(ctx, parent, (struct yin_argument_meta *)subelem->dest, exts);
                break;
            case LY_STMT_AUGMENT:
                ret = yin_parse_augment(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_BASE:
                ret = yin_parse_base(ctx, parent_stmt, subelem->dest, exts);
                break;
            case LY_STMT_BELONGS_TO:
                ret = yin_parse_belongs_to(ctx, (struct lysp_submodule *)subelem->dest, exts);
                break;
            case LY_STMT_BIT:
                ret = yin_parse_bit(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_CASE:
                ret = yin_parse_case(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CHOICE:
                ret = yin_parse_choice(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_CONFIG:
                ret = yin_parse_config(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_CONTACT:
            case LY_STMT_DESCRIPTION:
            case LY_STMT_ORGANIZATION:
            case LY_STMT_REFERENCE:
                ret = yin_parse_meta(ctx, parent, cur_stmt, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_CONTAINER:
                ret = yin_parse_container(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_DEFAULT:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_ERROR_APP_TAG:
            case LY_STMT_KEY:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_PRESENCE:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE, Y_STR_ARG, exts);
                break;
            case LY_STMT_DEVIATE:
                ret = yin_parse_deviate(ctx, (struct lysp_deviate **)subelem->dest);
                break;
            case LY_STMT_DEVIATION:
                ret = yin_parse_deviation(ctx, (struct lysp_deviation **)subelem->dest);
                break;
            case LY_STMT_ENUM:
                ret = yin_parse_enum(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_ERROR_MESSAGE:
                ret = yin_parse_err_msg(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_EXTENSION:
                ret = yin_parse_extension(ctx, (struct lysp_ext **)subelem->dest);
                break;
            case LY_STMT_FEATURE:
                ret = yin_parse_feature(ctx, (struct lysp_feature **)subelem->dest);
                break;
            case LY_STMT_FRACTION_DIGITS:
                ret = yin_parse_fracdigits(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_GROUPING:
                ret = yin_parse_grouping(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_IDENTITY:
                ret = yin_parse_identity(ctx, (struct lysp_ident **)subelem->dest);
                break;
            case LY_STMT_UNIQUE:
            case LY_STMT_IF_FEATURE:
                ret = yin_parse_qname(ctx, cur_stmt, subelem, exts);
                break;
            case LY_STMT_UNITS:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_NAME, Y_STR_ARG, exts);
                break;
            case LY_STMT_IMPORT:
                ret = yin_parse_import(ctx, (struct import_meta *)subelem->dest);
                break;
            case LY_STMT_INCLUDE:
                if ((parent_stmt == LY_STMT_SUBMODULE) && (PARSER_CUR_PMOD(ctx)->version == LYS_VERSION_1_1)) {
                    LOGWRN(PARSER_CTX(ctx), "YANG version 1.1 expects all includes in main module, includes in "
                            "submodules (%s) are not necessary.", ((struct lysp_submodule *)PARSER_CUR_PMOD(ctx))->name);
                }
                ret = yin_parse_include(ctx, (struct include_meta *)subelem->dest);
                break;
            case LY_STMT_INPUT:
            case LY_STMT_OUTPUT:
                ret = yin_parse_inout(ctx, cur_stmt, (struct inout_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF:
                ret = yin_parse_leaf(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LEAF_LIST:
                ret = yin_parse_leaflist(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_LENGTH:
                ret = yin_parse_length(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_LIST:
                ret = yin_parse_list(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_MANDATORY:
                ret = yin_parse_mandatory(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_MAX_ELEMENTS:
            case LY_STMT_MIN_ELEMENTS:
                ret = yin_parse_minmax(ctx, parent_stmt, cur_stmt, subelem->dest);
                break;
            case LY_STMT_MODIFIER:
                ret = yin_parse_modifier(ctx, parent, (const char **)subelem->dest, exts);
                break;
            case LY_STMT_MUST:
                ret = yin_parse_must(ctx, (struct lysp_restr **)subelem->dest);
                break;
            case LY_STMT_NAMESPACE:
                ret = yin_parse_simple_elem(ctx, parent, cur_stmt, subelem, YIN_ARG_URI, Y_STR_ARG, exts);
                break;
            case LY_STMT_NOTIFICATION:
                ret = yin_parse_notification(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_ORDERED_BY:
                ret = yin_parse_orderedby(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_PATH:
                ret = yin_parse_path(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_PATTERN:
                ret = yin_parse_pattern(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_VALUE:
            case LY_STMT_POSITION:
                ret = yin_parse_value_pos(ctx, cur_stmt, (struct lysp_type_enum *)subelem->dest);
                break;
            case LY_STMT_PREFIX:
                ret = yin_parse_simple_elem(ctx, *(const char **)subelem->dest, cur_stmt, subelem, YIN_ARG_VALUE,
                        Y_IDENTIF_ARG, exts);
                break;
            case LY_STMT_RANGE:
                ret = yin_parse_range(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REFINE:
                ret = yin_parse_refine(ctx, (struct lysp_refine **)subelem->dest);
                break;
            case LY_STMT_REQUIRE_INSTANCE:
                ret = yin_pasrse_reqinstance(ctx, (struct lysp_type *)subelem->dest);
                break;
            case LY_STMT_REVISION:
                ret = yin_parse_revision(ctx, (struct lysp_revision **)subelem->dest);
                break;
            case LY_STMT_REVISION_DATE:
                ret = yin_parse_revision_date(ctx, (char *)subelem->dest, exts);
                break;
            case LY_STMT_STATUS:
                ret = yin_parse_status(ctx, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_TYPE:
                ret = yin_parse_type(ctx, parent_stmt, subelem);
                break;
            case LY_STMT_TYPEDEF:
                ret = yin_parse_typedef(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_USES:
                ret = yin_parse_uses(ctx, (struct tree_node_meta *)subelem->dest);
                break;
            case LY_STMT_WHEN:
                ret = yin_parse_when(ctx, (struct lysp_when **)subelem->dest);
                break;
            case LY_STMT_YANG_VERSION:
                ret = yin_parse_yangversion(ctx, parent, (uint8_t *)subelem->dest, exts);
                break;
            case LY_STMT_YIN_ELEMENT:
                ret = yin_parse_yin_element(ctx, parent, (uint16_t *)subelem->dest, exts);
                break;
            case LY_STMT_ARG_TEXT:
            case LY_STMT_ARG_VALUE:
                /* TODO what to do with content/attributes? */
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                    LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
                }
                ret = yin_parse_content(ctx, NULL, 0, parent, cur_stmt, (const char **)subelem->dest, NULL);
                break;
            default:
                LOGINT(ctx->xmlctx->ctx);
                ret = LY_EINT;
            }
            LY_CHECK_GOTO(ret, cleanup);

            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        LY_CHECK_RET(ret);
        /* elements with text or none content */
        /* save text content, if text_content isn't set, it's just ignored */
        /* no resources are allocated in this branch, no need to use cleanup label */
        LY_CHECK_RET(yin_validate_value(ctx, Y_STR_ARG));
        if (text_content) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, *text_content);
            LY_CHECK_RET(!*text_content, LY_EMEM);
        }

        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

    /* mandatory subelements are checked only after whole element was succesfully parsed */
    LY_CHECK_RET(yin_check_subelem_mandatory_constraint(ctx, subelem_info, subelem_info_size, parent_stmt));

cleanup:
    return ret;
}